

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_remapper.h
# Opt level: O2

void __thiscall xray_re::xr_remapper::xr_remapper(xr_remapper *this,uint32_t min,uint32_t max)

{
  uint32_t *puVar1;
  ulong uVar2;
  
  this->m_min = min;
  this->m_max = max;
  uVar2 = (ulong)((max - min) + 1);
  puVar1 = (uint32_t *)operator_new__(uVar2 * 4);
  this->m_mapping = puVar1;
  std::__fill_n_a<unsigned_int*,unsigned_int,unsigned_int>(puVar1,uVar2,&BAD_IDX);
  return;
}

Assistant:

inline xr_remapper::xr_remapper(uint32_t min, uint32_t max): m_min(min), m_max(max)
{
	m_mapping = new uint32_t[max - min + 1];
#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1600
	stdext::unchecked_uninitialized_fill_n(m_mapping, max - min + 1, BAD_IDX);
#else
	std::uninitialized_fill_n(m_mapping, max - min + 1, BAD_IDX);
#endif
}